

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void initAvgEq(Index *pIdx)

{
  int iVar1;
  uint uVar2;
  IndexSample *pIVar3;
  tRowcnt *ptVar4;
  uint *puVar5;
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong local_40;
  
  if (pIdx != (Index *)0x0) {
    pIVar3 = pIdx->aSample;
    iVar1 = pIdx->nSample;
    local_40 = 1;
    if (1 < pIdx->nSampleCol) {
      local_40 = (ulong)(pIdx->nSampleCol - 1);
      pIdx->aAvgEq[local_40] = 1;
    }
    ptVar4 = pIdx->aAvgEq;
    puVar5 = pIdx->aiRowEst;
    uVar11 = 0;
    do {
      uVar2 = pIdx->nSample;
      if (((puVar5 == (uint *)0x0) || (pIdx->nKeyCol <= uVar11)) || ((ulong)puVar5[uVar11 + 1] == 0)
         ) {
        uVar14 = pIVar3[(long)iVar1 + -1].anLt[uVar11];
        uVar8 = (ulong)pIVar3[(long)iVar1 + -1].anDLt[uVar11] * 100;
        uVar9 = uVar2 - 1;
      }
      else {
        uVar14 = *puVar5;
        uVar8 = ((ulong)uVar14 * 100) / (ulong)puVar5[uVar11 + 1];
        uVar9 = uVar2;
      }
      pIdx->nRowEst0 = uVar14;
      iVar7 = 0;
      if ((int)uVar9 < 1) {
        uVar10 = 0;
        lVar13 = 0;
      }
      else {
        lVar12 = 0;
        lVar13 = 0;
        uVar10 = 0;
        do {
          if (((ulong)(uVar2 - 1) * 0x28 == lVar12) ||
             (*(int *)(*(long *)((long)&pIVar3->anDLt + lVar12) + uVar11 * 4) !=
              *(int *)(*(long *)((long)&pIVar3[1].anDLt + lVar12) + uVar11 * 4))) {
            uVar10 = uVar10 + *(int *)(*(long *)((long)&pIVar3->anEq + lVar12) + uVar11 * 4);
            lVar13 = lVar13 + 100;
          }
          lVar12 = lVar12 + 0x28;
        } while ((ulong)uVar9 * 0x28 != lVar12);
      }
      if ((uVar8 - lVar13 != 0 && lVar13 <= (long)uVar8) &&
         (uVar10 <= uVar14 && uVar14 - uVar10 != 0)) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (ulong)(uVar14 - uVar10) * 100;
        iVar7 = SUB164(auVar6 / SEXT816((long)(uVar8 - lVar13)),0);
      }
      ptVar4[uVar11] = iVar7 + (uint)(iVar7 == 0);
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_40);
  }
  return;
}

Assistant:

static void initAvgEq(Index *pIdx){
  if( pIdx ){
    IndexSample *aSample = pIdx->aSample;
    IndexSample *pFinal = &aSample[pIdx->nSample-1];
    int iCol;
    int nCol = 1;
    if( pIdx->nSampleCol>1 ){
      /* If this is stat4 data, then calculate aAvgEq[] values for all
      ** sample columns except the last. The last is always set to 1, as
      ** once the trailing PK fields are considered all index keys are
      ** unique.  */
      nCol = pIdx->nSampleCol-1;
      pIdx->aAvgEq[nCol] = 1;
    }
    for(iCol=0; iCol<nCol; iCol++){
      int nSample = pIdx->nSample;
      int i;                    /* Used to iterate through samples */
      tRowcnt sumEq = 0;        /* Sum of the nEq values */
      tRowcnt avgEq = 0;
      tRowcnt nRow;             /* Number of rows in index */
      i64 nSum100 = 0;          /* Number of terms contributing to sumEq */
      i64 nDist100;             /* Number of distinct values in index */

      if( !pIdx->aiRowEst || iCol>=pIdx->nKeyCol || pIdx->aiRowEst[iCol+1]==0 ){
        nRow = pFinal->anLt[iCol];
        nDist100 = (i64)100 * pFinal->anDLt[iCol];
        nSample--;
      }else{
        nRow = pIdx->aiRowEst[0];
        nDist100 = ((i64)100 * pIdx->aiRowEst[0]) / pIdx->aiRowEst[iCol+1];
      }
      pIdx->nRowEst0 = nRow;

      /* Set nSum to the number of distinct (iCol+1) field prefixes that
      ** occur in the stat4 table for this index. Set sumEq to the sum of 
      ** the nEq values for column iCol for the same set (adding the value 
      ** only once where there exist duplicate prefixes).  */
      for(i=0; i<nSample; i++){
        if( i==(pIdx->nSample-1)
         || aSample[i].anDLt[iCol]!=aSample[i+1].anDLt[iCol] 
        ){
          sumEq += aSample[i].anEq[iCol];
          nSum100 += 100;
        }
      }

      if( nDist100>nSum100 && sumEq<nRow ){
        avgEq = ((i64)100 * (nRow - sumEq))/(nDist100 - nSum100);
      }
      if( avgEq==0 ) avgEq = 1;
      pIdx->aAvgEq[iCol] = avgEq;
    }
  }
}